

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  ElimLt *this_00;
  int x;
  int iVar1;
  Var x_00;
  int iVar2;
  int *piVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  
  x = (this->heap).data[i];
  this_00 = &this->lt;
  do {
    iVar2 = i * 2 + 1;
    iVar1 = (this->heap).sz;
    if (iVar1 <= iVar2) break;
    iVar6 = i * 2 + 2;
    if (iVar6 < iVar1) {
      piVar3 = (this->heap).data;
      x_00 = piVar3[iVar2];
      uVar4 = SimpSolver::ElimLt::cost(this_00,piVar3[iVar6]);
      uVar5 = SimpSolver::ElimLt::cost(this_00,x_00);
      if (uVar5 <= uVar4) goto LAB_00112ece;
    }
    else {
LAB_00112ece:
      iVar6 = iVar2;
    }
    uVar4 = SimpSolver::ElimLt::cost(this_00,(this->heap).data[iVar6]);
    uVar5 = SimpSolver::ElimLt::cost(this_00,x);
    if (uVar4 < uVar5) {
      piVar3 = (this->heap).data;
      iVar2 = piVar3[iVar6];
      piVar3[i] = iVar2;
      if ((this->indices).map.sz <= iVar2) goto LAB_00112f58;
      (this->indices).map.data[iVar2] = i;
      i = iVar6;
    }
  } while (uVar4 < uVar5);
  (this->heap).data[i] = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = i;
    return;
  }
LAB_00112f58:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }